

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyStencilTest
          (UncommittedRegionsAccessTestCase *this,Functions *gl,ShaderProgram *program,GLint width,
          GLint height,GLint widthCommitted)

{
  void **__return_storage_ptr__;
  deUint32 program_00;
  RenderContext *context;
  uchar *puVar1;
  VertexArrayBinding *local_1e0;
  int local_180;
  GLint local_17c;
  int y;
  int x;
  GLubyte *dataStencilPtr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataStencil;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_101;
  string local_100;
  void **local_e0;
  undefined1 local_d8 [8];
  VertexArrayBinding vertexArrays [2];
  GLint widthCommitted_local;
  GLint height_local;
  GLint width_local;
  ShaderProgram *program_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  local_e0 = (void **)local_d8;
  vertexArrays[1].pointer.data._4_4_ = widthCommitted;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"vertex",&local_101);
  glu::va::Float((VertexArrayBinding *)local_d8,&local_100,3,4,0,(float *)gl4cts::vertices);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_e0 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"inTexCoord",&local_139);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_138,2,4,0,
                 (float *)gl4cts::texCoord);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::operator<<((ostream *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x88,"Perform Stencil Test - ");
  (*gl->clear)(0x4500);
  (*gl->enable)(0xb90);
  (*gl->stencilFunc)(0x204,1,0xff);
  (*gl->stencilOp)(0x1e00,0x1e00,0x1e01);
  context = deqp::Context::getRenderContext
                      ((this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
  program_00 = glu::ShaderProgram::getProgram(program);
  glu::pr::TriangleStrip
            ((PrimitiveList *)
             &dataStencil.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,6,(deUint32 *)gl4cts::indices);
  glu::draw(context,program_00,2,(VertexArrayBinding *)local_d8,
            (PrimitiveList *)
            &dataStencil.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(DrawUtilCallback *)0x0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataStencilPtr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataStencilPtr,
             (long)(width * height));
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataStencilPtr);
  (*gl->readPixels)(0,0,width,height,0x1901,0x1401,puVar1);
  local_17c = vertexArrays[1].pointer.data._4_4_;
  do {
    if (width <= local_17c) {
      (*gl->disable)(0xb90);
      this_local._7_1_ = true;
LAB_011964dc:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataStencilPtr);
      local_1e0 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
      do {
        local_1e0 = local_1e0 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_1e0);
      } while (local_1e0 != (VertexArrayBinding *)local_d8);
      return this_local._7_1_;
    }
    for (local_180 = 0; local_180 < height; local_180 = local_180 + 1) {
      if (puVar1[local_17c + local_180 * width] != '\0') {
        (*gl->disable)(0xb90);
        this_local._7_1_ = false;
        goto LAB_011964dc;
      }
    }
    local_17c = local_17c + 1;
  } while( true );
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyStencilTest(const Functions& gl, ShaderProgram& program, GLint width,
														 GLint height, GLint widthCommitted)
{
	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices),
											   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	mLog << "Perform Stencil Test - ";

	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_STENCIL_TEST);
	gl.stencilFunc(GL_GREATER, 1, 0xFF);
	gl.stencilOp(GL_KEEP, GL_KEEP, GL_REPLACE);

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));

	std::vector<GLubyte> dataStencil;
	dataStencil.resize(width * height);
	GLubyte* dataStencilPtr = dataStencil.data();

	gl.readPixels(0, 0, width, height, GL_STENCIL_INDEX, GL_UNSIGNED_BYTE, (GLvoid*)dataStencilPtr);
	for (int x = widthCommitted; x < width; ++x)
		for (int y = 0; y < height; ++y)
		{
			if (dataStencilPtr[x + y * width] != 0x00)
			{
				gl.disable(GL_STENCIL_TEST);
				return false;
			}
		}

	gl.disable(GL_STENCIL_TEST);
	return true;
}